

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O3

int __thiscall QDataWidgetMapper::mappedSection(QDataWidgetMapper *this,QWidget *widget)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  QWidget *pQVar8;
  
  lVar2 = *(long *)(*(long *)(this + 8) + 0xa0);
  lVar3 = *(long *)(*(long *)(this + 8) + 0xa8);
  if (lVar2 != lVar3) {
    lVar7 = 0;
    do {
      if ((*(long *)(lVar2 + lVar7) == 0) || (*(int *)(*(long *)(lVar2 + lVar7) + 4) == 0)) {
        pQVar8 = (QWidget *)0x0;
      }
      else {
        pQVar8 = *(QWidget **)(lVar2 + 8 + lVar7);
      }
      if (pQVar8 == widget) {
        iVar6 = (int)(lVar7 >> 3) * -0x49249249;
        if (iVar6 == -1) {
          return -1;
        }
        uVar4 = (ulong)iVar6;
        uVar5 = (lVar3 - lVar2 >> 3) * 0x6db6db6db6db6db7;
        if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
          return *(int *)(lVar2 + 0x10 + uVar4 * 0x38);
        }
        mappedSection();
      }
      lVar1 = lVar2 + lVar7;
      lVar7 = lVar7 + 0x38;
    } while (lVar1 + 0x38 != lVar3);
  }
  return -1;
}

Assistant:

int QDataWidgetMapper::mappedSection(QWidget *widget) const
{
    Q_D(const QDataWidgetMapper);

    int idx = d->findWidget(widget);
    if (idx == -1)
        return -1;

    return d->widgetMap[idx].section;
}